

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

void __thiscall CaDiCaL::Solver::reset_observed_vars(Solver *this)

{
  State *pSVar1;
  Solver *in_RDI;
  External *in_stack_00000030;
  char *in_stack_ffffffffffffffe8;
  
  if ((in_RDI->internal != (Internal *)0x0) && (in_RDI->trace_api_file != (FILE *)0x0)) {
    trace_api_call(in_RDI,in_stack_ffffffffffffffe8);
  }
  require_solver_pointer_to_be_non_zero(in_RDI,in_stack_ffffffffffffffe8,(char *)0xe27242);
  if (in_RDI->external == (External *)0x0) {
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
            "void CaDiCaL::Solver::reset_observed_vars()",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    fprintf(_stderr,"external solver not initialized");
    fputc(10,_stderr);
    fflush(_stderr);
    abort();
  }
  if (in_RDI->internal == (Internal *)0x0) {
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
            "void CaDiCaL::Solver::reset_observed_vars()",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    fprintf(_stderr,"internal solver not initialized");
    fputc(10,_stderr);
    fflush(_stderr);
    abort();
  }
  pSVar1 = state(in_RDI);
  if ((*pSVar1 & (UNSATISFIED|SATISFIED|SOLVING|ADDING|STEADY|CONFIGURING)) == 0) {
    fatal_message_start();
    fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ",
            "void CaDiCaL::Solver::reset_observed_vars()",
            "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
           );
    fprintf(_stderr,"solver neither in valid nor solving state");
    fputc(10,_stderr);
    fflush(_stderr);
    abort();
  }
  External::reset_observed_vars(in_stack_00000030);
  return;
}

Assistant:

void Solver::reset_observed_vars () {
  TRACE ("reset_observed_vars");
  REQUIRE_VALID_OR_SOLVING_STATE ();
  external->reset_observed_vars ();
  LOG_API_CALL_END ("reset_observed_vars");
}